

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::Renderbuffers::GetParameterErrorsTest::PrepareObjects
          (GetParameterErrorsTest *this)

{
  code *pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  deUint32 dVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  long lVar8;
  bool bVar9;
  bool bVar10;
  long lVar7;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar7 + 0x6e8))(1,&this->m_rbo_valid);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x2585);
  (**(code **)(lVar7 + 0xa0))(0x8d41,this->m_rbo_valid);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x2588);
  GVar6 = this->m_parameter_invalid;
  do {
    GVar6 = GVar6 + 1;
    lVar8 = 0;
    bVar2 = false;
    do {
      bVar9 = bVar2;
      bVar10 = *(GLenum *)((long)PrepareObjects()::valid_parameters + lVar8) == GVar6;
      lVar8 = lVar8 + 4;
      bVar2 = (bool)(bVar9 | bVar10);
    } while (lVar8 != 0x28);
  } while (bVar9 || bVar10);
  this->m_parameter_invalid = GVar6;
  do {
    pcVar1 = *(code **)(lVar7 + 0xca8);
    this->m_rbo_invalid = this->m_rbo_invalid + 1;
    cVar3 = (*pcVar1)();
  } while (cVar3 != '\0');
  return;
}

Assistant:

void GetParameterErrorsTest::PrepareObjects()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Valid objects. */
	gl.genRenderbuffers(1, &m_rbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	/* Invalid parameter. */
	bool is_parameter = true;

	while (is_parameter)
	{
		is_parameter = false;

		++m_parameter_invalid;

		static const glw::GLenum valid_parameters[] = { GL_RENDERBUFFER_WIDTH,			 GL_RENDERBUFFER_HEIGHT,
														GL_RENDERBUFFER_INTERNAL_FORMAT, GL_RENDERBUFFER_SAMPLES,
														GL_RENDERBUFFER_RED_SIZE,		 GL_RENDERBUFFER_GREEN_SIZE,
														GL_RENDERBUFFER_BLUE_SIZE,		 GL_RENDERBUFFER_ALPHA_SIZE,
														GL_RENDERBUFFER_DEPTH_SIZE,		 GL_RENDERBUFFER_STENCIL_SIZE };

		static const glw::GLuint valid_parameters_count = sizeof(valid_parameters) / sizeof(valid_parameters[0]);

		for (glw::GLuint i = 0; i < valid_parameters_count; ++i)
		{
			if (valid_parameters[i] == m_parameter_invalid)
			{
				is_parameter = true;
			}
		}
	}

	/* Invalid objects. */
	while (gl.isRenderbuffer(++m_rbo_invalid))
		;
}